

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::~ThreadLocal(ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
               *this)

{
  int iVar1;
  long *plVar2;
  GTestLog local_14;
  
  plVar2 = (long *)pthread_getspecific(this->key_);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  iVar1 = pthread_key_delete(this->key_);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/gtest/gtest.h"
                       ,0xa21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_key_delete(key_)",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_14);
  }
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::~vector
            (&this->default_);
  return;
}

Assistant:

~ThreadLocal() {
    // Destroys the managed object for the current thread, if any.
    DeleteThreadLocalValue(pthread_getspecific(key_));

    // Releases resources associated with the key.  This will *not*
    // delete managed objects for other threads.
    GTEST_CHECK_POSIX_SUCCESS_(pthread_key_delete(key_));
  }